

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

void MD5Transform(UINT4 *state,uchar *block)

{
  UINT4 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [16];
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  
  UVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  lVar19 = 0;
  do {
    auVar6[0xc] = block[lVar19 * 4 + 0xc];
    auVar6._0_12_ = ZEXT812(0);
    auVar7._10_3_ = auVar6._10_3_;
    auVar7._0_10_ = (unkuint10)block[lVar19 * 4 + 8] << 0x40;
    auVar15._5_8_ = 0;
    auVar15._0_5_ = auVar7._8_5_;
    uVar18 = CONCAT13(0,CONCAT12(block[lVar19 * 4 + 4],(ushort)block[lVar19 * 4]));
    auVar8[4] = block[lVar19 * 4 + 4];
    auVar8._0_4_ = uVar18;
    auVar8[5] = 0;
    auVar8._6_7_ = SUB137(auVar15 << 0x40,6);
    auVar25._0_4_ = uVar18 & 0xffff;
    auVar25._4_9_ = auVar8._4_9_;
    auVar25._13_3_ = 0;
    auVar9[0xc] = block[lVar19 * 4 + 0xd];
    auVar9._0_12_ = ZEXT812(0);
    auVar10._10_3_ = auVar9._10_3_;
    auVar10._0_10_ = (unkuint10)block[lVar19 * 4 + 9] << 0x40;
    auVar16._5_8_ = 0;
    auVar16._0_5_ = auVar10._8_5_;
    uVar18 = CONCAT13(0,CONCAT12(block[lVar19 * 4 + 5],(ushort)block[lVar19 * 4 + 1]));
    auVar11[4] = block[lVar19 * 4 + 5];
    auVar11._0_4_ = uVar18;
    auVar11[5] = 0;
    auVar11._6_7_ = SUB137(auVar16 << 0x40,6);
    auVar26._0_4_ = (uVar18 & 0xffff) << 8;
    auVar26._4_4_ = auVar11._4_4_ << 8;
    auVar26._8_4_ = auVar10._8_4_ << 8;
    auVar26._12_4_ = (uint)(uint3)(auVar9._10_3_ >> 0x10) << 8;
    auVar5[1] = 0;
    auVar5[0] = block[lVar19 * 4 + 6];
    auVar12._12_2_ = 0;
    auVar12._0_12_ = SUB1612((undefined1  [16])0x0,0);
    auVar12[0xe] = block[lVar19 * 4 + 0xe];
    auVar13[10] = block[lVar19 * 4 + 10];
    auVar13._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar13[0xb] = 0;
    auVar13._12_3_ = auVar12._12_3_;
    auVar14._10_5_ = auVar13._10_5_;
    auVar14._0_10_ = (unkuint10)0;
    auVar5._2_7_ = auVar14._8_7_;
    auVar5._9_7_ = 0;
    auVar27._4_12_ = SUB1612(auVar5 << 0x30,4);
    auVar27._0_4_ = (CONCAT11(block[lVar19 * 4 + 6],block[lVar19 * 4 + 2]) & 0xff) << 0x10;
    auVar17._1_4_ = (uint)block[lVar19 * 4 + 7] << 0x18;
    auVar17[0] = block[lVar19 * 4 + 3];
    auVar17._5_4_ = (uint)block[lVar19 * 4 + 0xb] << 0x18;
    auVar17._9_4_ = (uint)block[lVar19 * 4 + 0xf] << 0x18;
    auVar17._13_3_ = 0;
    *(undefined1 (*) [16])(&local_a8 + lVar19) = auVar17 << 0x18 | auVar27 | auVar25 | auVar26;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x10);
  uVar18 = ((uVar3 ^ uVar4) & uVar2 ^ uVar4) + UVar1 + local_a8 + 0xd76aa478;
  uVar18 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar2;
  uVar20 = ((uVar2 ^ uVar3) & uVar18 ^ uVar3) + uVar4 + local_a4 + 0xe8c7b756;
  uVar20 = (uVar20 * 0x1000 | uVar20 >> 0x14) + uVar18;
  uVar21 = ((uVar18 ^ uVar2) & uVar20 ^ uVar2) + local_a0 + uVar3 + 0x242070db;
  uVar21 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar20;
  uVar22 = local_9c + uVar2 + ((uVar20 ^ uVar18) & uVar21 ^ uVar18) + 0xc1bdceee;
  uVar23 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar21;
  uVar18 = uVar18 + local_98 + ((uVar21 ^ uVar20) & uVar23 ^ uVar20) + 0xf57c0faf;
  uVar18 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar23;
  uVar20 = uVar20 + local_94 + ((uVar23 ^ uVar21) & uVar18 ^ uVar21) + 0x4787c62a;
  uVar20 = (uVar20 * 0x1000 | uVar20 >> 0x14) + uVar18;
  uVar21 = uVar21 + local_90 + ((uVar18 ^ uVar23) & uVar20 ^ uVar23) + 0xa8304613;
  uVar22 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar20;
  uVar21 = ((uVar20 ^ uVar18) & uVar22 ^ uVar18) + uVar23 + local_8c + 0xfd469501;
  uVar23 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar22;
  uVar18 = ((uVar22 ^ uVar20) & uVar23 ^ uVar20) + uVar18 + local_88 + 0x698098d8;
  uVar21 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar23;
  uVar18 = uVar20 + local_84 + ((uVar23 ^ uVar22) & uVar21 ^ uVar22) + 0x8b44f7af;
  uVar20 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar21;
  uVar18 = (((uVar21 ^ uVar23) & uVar20 ^ uVar23) + uVar22 + local_80) - 0xa44f;
  uVar22 = (uVar18 * 0x20000 | uVar18 >> 0xf) + uVar20;
  uVar18 = ((uVar20 ^ uVar21) & uVar22 ^ uVar21) + uVar23 + local_7c + 0x895cd7be;
  uVar18 = (uVar18 * 0x400000 | uVar18 >> 10) + uVar22;
  uVar21 = ((uVar22 ^ uVar20) & uVar18 ^ uVar20) + uVar21 + local_78 + 0x6b901122;
  uVar23 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar18;
  uVar20 = ((uVar18 ^ uVar22) & uVar23 ^ uVar22) + uVar20 + local_74 + 0xfd987193;
  uVar20 = (uVar20 * 0x1000 | uVar20 >> 0x14) + uVar23;
  uVar21 = uVar22 + local_70 + (uVar18 & ~uVar20 | uVar20 & uVar23) + 0xa679438e;
  uVar21 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar20;
  uVar18 = uVar18 + local_6c + (uVar23 & ~uVar21 | uVar21 & uVar20) + 0x49b40821;
  uVar18 = (uVar18 * 0x400000 | uVar18 >> 10) + uVar21;
  uVar22 = uVar23 + local_a4 + (~uVar20 & uVar21 | uVar18 & uVar20) + 0xf61e2562;
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar18;
  uVar20 = uVar20 + local_90 + (~uVar21 & uVar18 | uVar22 & uVar21) + 0xc040b340;
  uVar20 = (uVar20 * 0x200 | uVar20 >> 0x17) + uVar22;
  uVar21 = uVar21 + local_7c + ((uVar20 ^ uVar22) & uVar18 ^ uVar22) + 0x265e5a51;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar20;
  uVar18 = uVar18 + local_a8 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xe9b6c7aa;
  uVar18 = (uVar18 * 0x100000 | uVar18 >> 0xc) + uVar21;
  uVar22 = uVar22 + local_94 + ((uVar18 ^ uVar21) & uVar20 ^ uVar21) + 0xd62f105d;
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar18;
  uVar20 = uVar20 + local_80 + ((uVar22 ^ uVar18) & uVar21 ^ uVar18) + 0x2441453;
  uVar20 = (uVar20 * 0x200 | uVar20 >> 0x17) + uVar22;
  uVar21 = uVar21 + local_6c + ((uVar20 ^ uVar22) & uVar18 ^ uVar22) + 0xd8a1e681;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar20;
  uVar18 = uVar18 + local_98 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xe7d3fbc8;
  uVar18 = (uVar18 * 0x100000 | uVar18 >> 0xc) + uVar21;
  uVar22 = uVar22 + local_84 + ((uVar18 ^ uVar21) & uVar20 ^ uVar21) + 0x21e1cde6;
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar18;
  uVar20 = uVar20 + local_70 + ((uVar22 ^ uVar18) & uVar21 ^ uVar18) + 0xc33707d6;
  uVar20 = (uVar20 * 0x200 | uVar20 >> 0x17) + uVar22;
  uVar21 = uVar21 + local_9c + ((uVar20 ^ uVar22) & uVar18 ^ uVar22) + 0xf4d50d87;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar20;
  uVar18 = uVar18 + local_88 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0x455a14ed;
  uVar18 = (uVar18 * 0x100000 | uVar18 >> 0xc) + uVar21;
  uVar22 = uVar22 + local_74 + ((uVar18 ^ uVar21) & uVar20 ^ uVar21) + 0xa9e3e905;
  uVar22 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar18;
  uVar20 = uVar20 + local_a0 + ((uVar22 ^ uVar18) & uVar21 ^ uVar18) + 0xfcefa3f8;
  uVar20 = (uVar20 * 0x200 | uVar20 >> 0x17) + uVar22;
  uVar21 = uVar21 + local_8c + ((uVar20 ^ uVar22) & uVar18 ^ uVar22) + 0x676f02d9;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar20;
  uVar18 = ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + uVar18 + local_78 + 0x8d2a4c8a;
  uVar23 = (uVar18 * 0x100000 | uVar18 >> 0xc) + uVar21;
  uVar18 = ((uVar23 ^ uVar21 ^ uVar20) + uVar22 + local_94) - 0x5c6be;
  uVar24 = (uVar18 * 0x10 | uVar18 >> 0x1c) + uVar23;
  uVar18 = (uVar23 ^ uVar21 ^ uVar24) + uVar20 + local_88 + 0x8771f681;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar24;
  uVar20 = (uVar24 ^ uVar23 ^ uVar18) + uVar21 + local_7c + 0x6d9d6122;
  uVar22 = (uVar20 * 0x10000 | uVar20 >> 0x10) + uVar18;
  uVar20 = (uVar18 ^ uVar24 ^ uVar22) + uVar23 + local_70 + 0xfde5380c;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar22;
  uVar21 = (uVar22 ^ uVar18 ^ uVar20) + uVar24 + local_a4 + 0xa4beea44;
  uVar21 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar20;
  uVar18 = uVar18 + local_98 + (uVar20 ^ uVar22 ^ uVar21) + 0x4bdecfa9;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar21;
  uVar22 = uVar22 + local_8c + (uVar21 ^ uVar20 ^ uVar18) + 0xf6bb4b60;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar18;
  uVar20 = uVar20 + local_80 + (uVar18 ^ uVar21 ^ uVar22) + 0xbebfbc70;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar22;
  uVar21 = uVar21 + local_74 + (uVar22 ^ uVar18 ^ uVar20) + 0x289b7ec6;
  uVar21 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar20;
  uVar18 = uVar18 + local_a8 + (uVar20 ^ uVar22 ^ uVar21) + 0xeaa127fa;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar21;
  uVar22 = uVar22 + local_9c + (uVar21 ^ uVar20 ^ uVar18) + 0xd4ef3085;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar18;
  uVar20 = (uVar18 ^ uVar21 ^ uVar22) + uVar20 + local_90 + 0x4881d05;
  uVar24 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar22;
  uVar20 = uVar21 + local_84 + (uVar22 ^ uVar18 ^ uVar24) + 0xd9d4d039;
  uVar21 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar18 = (uVar24 ^ uVar22 ^ uVar21) + uVar18 + local_78 + 0xe6db99e5;
  uVar20 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar21;
  uVar18 = uVar22 + local_6c + (uVar21 ^ uVar24 ^ uVar20) + 0x1fa27cf8;
  uVar23 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar20;
  uVar18 = (uVar20 ^ uVar21 ^ uVar23) + uVar24 + local_a0 + 0xc4ac5665;
  uVar18 = (uVar18 * 0x800000 | uVar18 >> 9) + uVar23;
  uVar21 = ((~uVar20 | uVar18) ^ uVar23) + uVar21 + local_a8 + 0xf4292244;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar18;
  uVar20 = ((~uVar23 | uVar21) ^ uVar18) + uVar20 + local_8c + 0x432aff97;
  uVar22 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar21;
  uVar20 = ((~uVar18 | uVar22) ^ uVar21) + uVar23 + local_70 + 0xab9423a7;
  uVar20 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar22;
  uVar18 = uVar18 + local_94 + ((~uVar21 | uVar20) ^ uVar22) + 0xfc93a039;
  uVar18 = (uVar18 * 0x200000 | uVar18 >> 0xb) + uVar20;
  uVar21 = ((~uVar22 | uVar18) ^ uVar20) + uVar21 + local_78 + 0x655b59c3;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar18;
  uVar22 = uVar22 + local_9c + ((~uVar20 | uVar21) ^ uVar18) + 0x8f0ccc92;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar21;
  uVar20 = (uVar20 + local_80 + ((~uVar18 | uVar22) ^ uVar21)) - 0x100b83;
  uVar20 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar22;
  uVar18 = uVar18 + local_a4 + ((~uVar21 | uVar20) ^ uVar22) + 0x85845dd1;
  uVar18 = (uVar18 * 0x200000 | uVar18 >> 0xb) + uVar20;
  uVar21 = uVar21 + local_88 + ((~uVar22 | uVar18) ^ uVar20) + 0x6fa87e4f;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar18;
  uVar22 = uVar22 + local_6c + ((~uVar20 | uVar21) ^ uVar18) + 0xfe2ce6e0;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar21;
  uVar20 = uVar20 + local_90 + ((~uVar18 | uVar22) ^ uVar21) + 0xa3014314;
  uVar20 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar22;
  uVar18 = uVar18 + local_74 + ((~uVar21 | uVar20) ^ uVar22) + 0x4e0811a1;
  uVar18 = (uVar18 * 0x200000 | uVar18 >> 0xb) + uVar20;
  uVar21 = uVar21 + local_98 + ((~uVar22 | uVar18) ^ uVar20) + 0xf7537e82;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar18;
  uVar22 = uVar22 + local_7c + ((~uVar20 | uVar21) ^ uVar18) + 0xbd3af235;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar21;
  uVar20 = uVar20 + local_a0 + ((~uVar18 | uVar22) ^ uVar21) + 0x2ad7d2bb;
  uVar20 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar22;
  uVar18 = uVar18 + local_84 + ((~uVar21 | uVar20) ^ uVar22) + 0xeb86d391;
  *state = uVar21 + UVar1;
  state[1] = uVar2 + uVar20 + (uVar18 * 0x200000 | uVar18 >> 0xb);
  state[2] = uVar20 + uVar3;
  state[3] = uVar22 + uVar4;
  return;
}

Assistant:

static void MD5Transform(UINT4 state[4],
                         const unsigned char block[64])
{
  UINT4 a = state[0], b = state[1], c = state[2], d = state[3], x[16];

  Decode (x, block, 64);

  /* Round 1 */
  FF (a, b, c, d, x[ 0], S11, 0xd76aa478); /* 1 */
  FF (d, a, b, c, x[ 1], S12, 0xe8c7b756); /* 2 */
  FF (c, d, a, b, x[ 2], S13, 0x242070db); /* 3 */
  FF (b, c, d, a, x[ 3], S14, 0xc1bdceee); /* 4 */
  FF (a, b, c, d, x[ 4], S11, 0xf57c0faf); /* 5 */
  FF (d, a, b, c, x[ 5], S12, 0x4787c62a); /* 6 */
  FF (c, d, a, b, x[ 6], S13, 0xa8304613); /* 7 */
  FF (b, c, d, a, x[ 7], S14, 0xfd469501); /* 8 */
  FF (a, b, c, d, x[ 8], S11, 0x698098d8); /* 9 */
  FF (d, a, b, c, x[ 9], S12, 0x8b44f7af); /* 10 */
  FF (c, d, a, b, x[10], S13, 0xffff5bb1); /* 11 */
  FF (b, c, d, a, x[11], S14, 0x895cd7be); /* 12 */
  FF (a, b, c, d, x[12], S11, 0x6b901122); /* 13 */
  FF (d, a, b, c, x[13], S12, 0xfd987193); /* 14 */
  FF (c, d, a, b, x[14], S13, 0xa679438e); /* 15 */
  FF (b, c, d, a, x[15], S14, 0x49b40821); /* 16 */

 /* Round 2 */
  GG (a, b, c, d, x[ 1], S21, 0xf61e2562); /* 17 */
  GG (d, a, b, c, x[ 6], S22, 0xc040b340); /* 18 */
  GG (c, d, a, b, x[11], S23, 0x265e5a51); /* 19 */
  GG (b, c, d, a, x[ 0], S24, 0xe9b6c7aa); /* 20 */
  GG (a, b, c, d, x[ 5], S21, 0xd62f105d); /* 21 */
  GG (d, a, b, c, x[10], S22,  0x2441453); /* 22 */
  GG (c, d, a, b, x[15], S23, 0xd8a1e681); /* 23 */
  GG (b, c, d, a, x[ 4], S24, 0xe7d3fbc8); /* 24 */
  GG (a, b, c, d, x[ 9], S21, 0x21e1cde6); /* 25 */
  GG (d, a, b, c, x[14], S22, 0xc33707d6); /* 26 */
  GG (c, d, a, b, x[ 3], S23, 0xf4d50d87); /* 27 */
  GG (b, c, d, a, x[ 8], S24, 0x455a14ed); /* 28 */
  GG (a, b, c, d, x[13], S21, 0xa9e3e905); /* 29 */
  GG (d, a, b, c, x[ 2], S22, 0xfcefa3f8); /* 30 */
  GG (c, d, a, b, x[ 7], S23, 0x676f02d9); /* 31 */
  GG (b, c, d, a, x[12], S24, 0x8d2a4c8a); /* 32 */

  /* Round 3 */
  HH (a, b, c, d, x[ 5], S31, 0xfffa3942); /* 33 */
  HH (d, a, b, c, x[ 8], S32, 0x8771f681); /* 34 */
  HH (c, d, a, b, x[11], S33, 0x6d9d6122); /* 35 */
  HH (b, c, d, a, x[14], S34, 0xfde5380c); /* 36 */
  HH (a, b, c, d, x[ 1], S31, 0xa4beea44); /* 37 */
  HH (d, a, b, c, x[ 4], S32, 0x4bdecfa9); /* 38 */
  HH (c, d, a, b, x[ 7], S33, 0xf6bb4b60); /* 39 */
  HH (b, c, d, a, x[10], S34, 0xbebfbc70); /* 40 */
  HH (a, b, c, d, x[13], S31, 0x289b7ec6); /* 41 */
  HH (d, a, b, c, x[ 0], S32, 0xeaa127fa); /* 42 */
  HH (c, d, a, b, x[ 3], S33, 0xd4ef3085); /* 43 */
  HH (b, c, d, a, x[ 6], S34,  0x4881d05); /* 44 */
  HH (a, b, c, d, x[ 9], S31, 0xd9d4d039); /* 45 */
  HH (d, a, b, c, x[12], S32, 0xe6db99e5); /* 46 */
  HH (c, d, a, b, x[15], S33, 0x1fa27cf8); /* 47 */
  HH (b, c, d, a, x[ 2], S34, 0xc4ac5665); /* 48 */

  /* Round 4 */
  II (a, b, c, d, x[ 0], S41, 0xf4292244); /* 49 */
  II (d, a, b, c, x[ 7], S42, 0x432aff97); /* 50 */
  II (c, d, a, b, x[14], S43, 0xab9423a7); /* 51 */
  II (b, c, d, a, x[ 5], S44, 0xfc93a039); /* 52 */
  II (a, b, c, d, x[12], S41, 0x655b59c3); /* 53 */
  II (d, a, b, c, x[ 3], S42, 0x8f0ccc92); /* 54 */
  II (c, d, a, b, x[10], S43, 0xffeff47d); /* 55 */
  II (b, c, d, a, x[ 1], S44, 0x85845dd1); /* 56 */
  II (a, b, c, d, x[ 8], S41, 0x6fa87e4f); /* 57 */
  II (d, a, b, c, x[15], S42, 0xfe2ce6e0); /* 58 */
  II (c, d, a, b, x[ 6], S43, 0xa3014314); /* 59 */
  II (b, c, d, a, x[13], S44, 0x4e0811a1); /* 60 */
  II (a, b, c, d, x[ 4], S41, 0xf7537e82); /* 61 */
  II (d, a, b, c, x[11], S42, 0xbd3af235); /* 62 */
  II (c, d, a, b, x[ 2], S43, 0x2ad7d2bb); /* 63 */
  II (b, c, d, a, x[ 9], S44, 0xeb86d391); /* 64 */

  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;

  /* Zeroize sensitive information. */
  memset((void *)x, 0, sizeof (x));
}